

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O2

string * __thiscall
CodeGenerator::generate_java_code_abi_cxx11_(string *__return_storage_ptr__,CodeGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 "// Generated by program-homework-solver \n\nclass test{\n\n\tpublic int f(int x){\n\t\tint answer = "
                 ,&this->func);
  std::operator+(__return_storage_ptr__,&local_30,
                 ";\n\t\treturn answer;\n}\n\n\tpublic static void main(String args[]){\n\t\ttest t = new test();\n\t\tfor(int i=0; i<20; i++){\n\t\t\tSystem.out.println(t.f(i));\n\t\t}\n\n\t}\n}"
                );
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string CodeGenerator::generate_java_code() {
    string code =
            "// Generated by program-homework-solver \n\n"
            "class test{\n\n"
            "\tpublic int f(int x){\n"
            "\t\tint answer = " + CodeGenerator::func +";\n"
            "\t\treturn answer;\n"
            "}\n\n"
            "\tpublic static void main(String args[]){\n"
            "\t\ttest t = new test();\n"
            "\t\tfor(int i=0; i<20; i++){\n"
            "\t\t\tSystem.out.println(t.f(i));\n"
            "\t\t}\n"
            "\n\t}"
            "\n}";

    return code;
}